

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

double get_kf_group_avg_error
                 (TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,FIRSTPASS_STATS *first_frame,
                 FIRSTPASS_STATS *start_position,int frames_to_key)

{
  int iVar1;
  FIRSTPASS_STATS *in_RCX;
  void *in_RDX;
  TWO_PASS_FRAME *in_RSI;
  int in_R8D;
  double kf_group_avg_error;
  int i;
  int num_frames;
  FIRSTPASS_STATS cur_frame;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  TWO_PASS_FRAME *p_frame;
  int iVar2;
  undefined4 in_stack_fffffffffffffeec;
  undefined1 local_110 [32];
  double local_f0;
  int local_24;
  FIRSTPASS_STATS *local_20;
  TWO_PASS_FRAME *local_10;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_10 = in_RSI;
  memcpy(local_110,in_RDX,0xe8);
  p_frame = (TWO_PASS_FRAME *)0x0;
  reset_fpf_position(local_10,local_20);
  for (iVar2 = 0; iVar2 < local_24; iVar2 = iVar2 + 1) {
    p_frame = (TWO_PASS_FRAME *)(local_f0 + (double)p_frame);
    iVar1 = input_stats((TWO_PASS *)CONCAT44(in_stack_fffffffffffffeec,iVar2),p_frame,
                        (FIRSTPASS_STATS *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (iVar1 == -1) break;
  }
  if (iVar2 + 1 < local_24) {
    local_24 = iVar2 + 1;
  }
  return (double)p_frame / (double)local_24;
}

Assistant:

static double get_kf_group_avg_error(TWO_PASS *twopass,
                                     TWO_PASS_FRAME *twopass_frame,
                                     const FIRSTPASS_STATS *first_frame,
                                     const FIRSTPASS_STATS *start_position,
                                     int frames_to_key) {
  FIRSTPASS_STATS cur_frame = *first_frame;
  int num_frames, i;
  double kf_group_avg_error = 0.0;

  reset_fpf_position(twopass_frame, start_position);

  for (i = 0; i < frames_to_key; ++i) {
    kf_group_avg_error += cur_frame.coded_error;
    if (EOF == input_stats(twopass, twopass_frame, &cur_frame)) break;
  }
  num_frames = i + 1;
  num_frames = AOMMIN(num_frames, frames_to_key);
  kf_group_avg_error = kf_group_avg_error / num_frames;

  return (kf_group_avg_error);
}